

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pic_is4(stbi__context *s,char *str)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  long lVar3;
  
  psVar1 = s->img_buffer;
  lVar3 = 0;
  do {
    if (psVar1 < s->img_buffer_end) {
LAB_00165696:
      s->img_buffer = psVar1 + 1;
      sVar2 = *psVar1;
      psVar1 = psVar1 + 1;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar1 = s->img_buffer;
        goto LAB_00165696;
      }
      sVar2 = '\0';
    }
    if (sVar2 != str[lVar3]) {
      return 0;
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_is4(stbi__context *s,const char *str)
{
   int i;
   for (i=0; i<4; ++i)
      if (stbi__get8(s) != (stbi_uc)str[i])
         return 0;

   return 1;
}